

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O3

Map<bool,_bool> * __thiscall
google::protobuf::internal::TypeDefinedMapFieldBase<bool,_bool>::MutableMap
          (TypeDefinedMapFieldBase<bool,_bool> *this)

{
  TaggedPtr p;
  ReflectionPayload *pRVar1;
  
  MapFieldBase::SyncMapWithRepeatedField(&this->super_MapFieldBase);
  p = (this->super_MapFieldBase).super_MapFieldBaseForParse.payload_._M_i;
  if ((p & 1) != 0) {
    pRVar1 = MapFieldBase::ToPayload(p);
    if (pRVar1 != (ReflectionPayload *)0x0) {
      (pRVar1->state)._M_i = STATE_MODIFIED_MAP;
    }
  }
  return (Map<bool,_bool> *)&this->field_0;
}

Assistant:

Map<Key, T>* MutableMap() {
    SyncMapWithRepeatedField();
    SetMapDirty();
    return &map_;
  }